

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoSaveBestDelayCut(Sbd_Sto_t *p,int iObj,int *pCut)

{
  Sbd_Cut_t *pSVar1;
  int local_2c;
  int i;
  Sbd_Cut_t *pCutBest;
  int *pCut_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  pSVar1 = p->ppCuts[p->iCutBest];
  if (iObj == p->Pivot) {
    *pCut = *(uint *)&pSVar1->field_0x14 >> 0x1c;
    for (local_2c = 0; local_2c < (int)(*(uint *)&pSVar1->field_0x14 >> 0x1c);
        local_2c = local_2c + 1) {
      pCut[local_2c + 1] = pSVar1->pLeaves[local_2c];
    }
    return;
  }
  __assert_fail("iObj == p->Pivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                ,0x2e5,"void Sbd_StoSaveBestDelayCut(Sbd_Sto_t *, int, int *)");
}

Assistant:

void Sbd_StoSaveBestDelayCut( Sbd_Sto_t * p, int iObj, int * pCut )
{
    Sbd_Cut_t * pCutBest = p->ppCuts[p->iCutBest]; int i;
    assert( iObj == p->Pivot );
    pCut[0] = pCutBest->nLeaves;
    for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
        pCut[i+1] = pCutBest->pLeaves[i];
}